

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O3

string * __thiscall
hexpattern::datamask2regex_abi_cxx11_
          (string *__return_storage_ptr__,hexpattern *this,ByteMaskType *datamask)

{
  byte bVar1;
  pointer puVar2;
  char *__s;
  uint uVar3;
  ulong uVar4;
  string local_58;
  uint local_38;
  uint local_34;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar2 = (datamask->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((datamask->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    uVar4 = 0;
    do {
      bVar1 = (datamask->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar4];
      if (bVar1 < 0xf0) {
        __s = ".";
        if (bVar1 != 0) {
          if (bVar1 != 0xf) goto LAB_0010af24;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,"[");
          uVar3 = 0xfffffff0;
          do {
            local_38 = ((datamask->first).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar4] & 0xf) + uVar3 + 0x10;
            stringformat<int>(&local_58,"\\x%02x",(int *)&local_38);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            uVar3 = uVar3 + 0x10;
          } while (uVar3 < 0xf0);
          __s = "]";
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,__s);
      }
      else {
        if (bVar1 == 0xf0) {
          local_38 = puVar2[uVar4] & 0xfffffff0;
          local_34 = puVar2[uVar4] | 0xf;
          stringformat<int,int>(&local_58,"[\\x%02x-\\x%02x]",(int *)&local_38,(int *)&local_34);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        }
        else {
          if (bVar1 != 0xff) goto LAB_0010af24;
          stringformat<unsigned_char_const&>(&local_58,"\\x%02x",puVar2 + uVar4);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
LAB_0010af24:
      uVar4 = (ulong)((int)uVar4 + 1);
      puVar2 = (datamask->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(datamask->first).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string datamask2regex(const ByteMaskType & datamask)
    {
        auto & data = datamask.first;
        auto & mask = datamask.second;

        std::string regex;
        for (unsigned i = 0 ; i < data.size() ; i++)
        {
            switch(mask[i])
            {
                case 0: regex += "."; break;
                case 0xF0: regex += stringformat("[\\x%02x-\\x%02x]", data[i] & 0xF0, (data[i] & 0xF0) | 0x0F); break;
                case 0x0F:
                           {
                               regex += "[";
                               for (int c = 0 ; c < 0x100 ; c += 0x10)
                                   regex += stringformat("\\x%02x", c + (data[i] & 0x0F));
                               regex += "]";
                           }
                           break;
                case 0xFF: regex += stringformat("\\x%02x", data[i]); break;
            }
        }

        return regex;
    }